

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O0

void __thiscall
cmCursesLongMessageForm::Render
          (cmCursesLongMessageForm *this,int param_1,int param_2,int param_3,int param_4)

{
  FIELD *pFVar1;
  FORM *pFVar2;
  char *msg;
  int local_44;
  int local_38;
  int local_34;
  int y;
  int x;
  int param_4_local;
  int param_3_local;
  int param_2_local;
  int param_1_local;
  cmCursesLongMessageForm *this_local;
  
  if (_stdscr == 0) {
    local_34 = -1;
    local_38 = -1;
  }
  else {
    local_34 = *(short *)(_stdscr + 4) + 1;
    local_38 = *(short *)(_stdscr + 6) + 1;
  }
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    unpost_form((this->super_cmCursesForm).Form);
    free_form((this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields[0] != (FIELD *)0x0) {
    free_field(this->Fields[0]);
    this->Fields[0] = (FIELD *)0x0;
  }
  pFVar1 = new_field(local_34 + -6,local_38 + -2,1,1,0,0);
  this->Fields[0] = pFVar1;
  field_opts_off(this->Fields[0],0x200);
  pFVar2 = new_form(this->Fields);
  (this->super_cmCursesForm).Form = pFVar2;
  post_form((this->super_cmCursesForm).Form);
  form_driver((this->super_cmCursesForm).Form,0x216);
  msg = (char *)std::__cxx11::string::c_str();
  DrawMessage(this,msg);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
  if (_stdscr == 0) {
    local_44 = -1;
  }
  else {
    local_44 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,local_44,1);
  refresh();
  return;
}

Assistant:

void cmCursesLongMessageForm::Render(int /*left*/, int /*top*/, int /*width*/,
                                     int /*height*/)
{
  int x;
  int y;
  getmaxyx(stdscr, y, x);

  if (this->Form) {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = nullptr;
  }

  if (this->Fields[0]) {
    free_field(this->Fields[0]);
    this->Fields[0] = nullptr;
  }

  this->Fields[0] = new_field(y - 6, x - 2, 1, 1, 0, 0);

  field_opts_off(this->Fields[0], O_STATIC);

  this->Form = new_form(this->Fields);
  post_form(this->Form);

  form_driver(this->Form, REQ_BEG_FIELD);
  this->DrawMessage(this->Messages.c_str());

  this->UpdateStatusBar();
  touchwin(stdscr);
  refresh();
}